

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.c
# Opt level: O2

time_t time(time_t *__timer)

{
  int iVar1;
  timeval tv;
  
  iVar1 = gettimeofday((timeval *)&tv,(__timezone_ptr_t)0x0);
  if (iVar1 == 0) {
    if (__timer != (time_t *)0x0) {
      *__timer = tv.tv_sec;
    }
  }
  else {
    tv.tv_sec = -1;
  }
  return tv.tv_sec;
}

Assistant:

time_t time( time_t * timer )
{
    struct timeval tv;

    if ( gettimeofday( &tv, NULL ) == 0 )
    {
        if ( timer != NULL )
        {
            *timer = tv.tv_sec;
        }

        return tv.tv_sec;
    }

    return -1;
}